

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O2

int IoTHubClient_Auth_Get_x509_info
              (IOTHUB_AUTHORIZATION_HANDLE handle,char **x509_cert,char **x509_key)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  CREDENTIAL_RESULT *__ptr;
  int iVar3;
  char *pcVar4;
  
  if ((x509_cert == (char **)0x0 || handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) ||
      x509_key == (char **)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x139;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
              ,"IoTHubClient_Auth_Get_x509_info",0x138,1,
              "Invalid Parameter handle: %p, x509_cert: %p, x509_key: %p",handle,x509_cert,x509_key)
    ;
    return 0x139;
  }
  if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC) {
    __ptr = iothub_device_auth_generate_credentials
                      (handle->device_auth_handle,(DEVICE_AUTH_CREDENTIAL_INFO *)0x0);
    if (__ptr != (CREDENTIAL_RESULT *)0x0) {
      iVar1 = mallocAndStrcpy_s(x509_cert,(__ptr->auth_cred_result).x509_result.x509_cert);
      if (iVar1 == 0) {
        iVar1 = mallocAndStrcpy_s(x509_key,(__ptr->auth_cred_result).x509_result.x509_alias_key);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                      ,"IoTHubClient_Auth_Get_x509_info",0x152,1,"Failure copying private key");
          }
          free(*x509_cert);
          iVar1 = 0x153;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x14e;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                    ,"IoTHubClient_Auth_Get_x509_info",0x14d,1,"Failure copying certificate");
        }
      }
      free(__ptr);
      return iVar1;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x147;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x147;
    }
    pcVar4 = "Failure generating credentials";
    iVar3 = 0x146;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x13e;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x13e;
    }
    pcVar4 = "Invalid credential types for this operation";
    iVar3 = 0x13d;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
            ,"IoTHubClient_Auth_Get_x509_info",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int IoTHubClient_Auth_Get_x509_info(IOTHUB_AUTHORIZATION_HANDLE handle, char** x509_cert, char** x509_key)
{
    int result;
    if (handle == NULL || x509_cert == NULL || x509_key == NULL)
    {
        LogError("Invalid Parameter handle: %p, x509_cert: %p, x509_key: %p", handle, x509_cert, x509_key);
        result = MU_FAILURE;
    }
    else if (handle->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
    {
        LogError("Invalid credential types for this operation");
        result = MU_FAILURE;
    }
    else
    {
#ifdef USE_PROV_MODULE
        CREDENTIAL_RESULT* cred_result = iothub_device_auth_generate_credentials(handle->device_auth_handle, NULL);
        if (cred_result == NULL)
        {
            LogError("Failure generating credentials");
            result = MU_FAILURE;
        }
        else
        {
            if (mallocAndStrcpy_s(x509_cert, cred_result->auth_cred_result.x509_result.x509_cert) != 0)
            {
                LogError("Failure copying certificate");
                result = MU_FAILURE;
            }
            else if (mallocAndStrcpy_s(x509_key, cred_result->auth_cred_result.x509_result.x509_alias_key) != 0)
            {
                LogError("Failure copying private key");
                result = MU_FAILURE;
                free(*x509_cert);
            }
            else
            {
                result = 0;
            }
            free(cred_result);
        }
#else
        LogError("Failed HSM module is not supported");
        result = MU_FAILURE;
#endif
    }
    return result;
}